

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O3

bool legacy::getSlicingCriteriaNodes
               (LLVMDependenceGraph *dg,string *slicingCriteria,string *secondarySlicingCriteria,
               set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
               *criteria_nodes,bool criteria_are_next_instr)

{
  undefined2 *puVar1;
  undefined4 *puVar2;
  pointer pcVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  pointer ppVar8;
  bool bVar9;
  int iVar10;
  _Rb_tree_node_base *p_Var11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  _Base_ptr p_Var15;
  pointer pbVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  _Rb_tree_node_base *p_Var18;
  raw_ostream *prVar19;
  ulong uVar20;
  long lVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  undefined1 auVar22 [8];
  string *psVar23;
  const_iterator __end1_1;
  char *pcVar24;
  undefined3 in_register_00000081;
  const_iterator __begin1_2;
  Value *V;
  const_iterator __begin1_1;
  Instruction *I;
  iterator __begin1;
  iterator __end1;
  undefined1 auVar25 [16];
  pair<std::_Rb_tree_iterator<dg::BBlock<dg::LLVMNode>_*>,_bool> pVar26;
  int line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  line_criteria;
  pair<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  secondaryCriteria;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  node_criteria;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  control_criteria;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  parsedCrit;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  criteria;
  int local_1ec;
  undefined1 local_1e8 [32];
  _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
  local_1c8;
  long local_198;
  undefined1 local_190 [16];
  undefined1 local_180 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_170;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  undefined4 local_12c;
  undefined1 local_128 [32];
  undefined1 local_108 [16];
  _Link_type local_f8;
  _Base_ptr p_Stack_f0;
  _Base_ptr local_e8;
  _Map_pointer pppBStack_e0;
  _Base_ptr local_d8;
  _Base_ptr p_Stack_d0;
  _Base_ptr local_c8;
  _Map_pointer pppBStack_c0;
  _Rb_tree_node_base *local_b0;
  undefined1 local_a8 [8];
  pointer ppStack_a0;
  _Link_type local_98;
  _Base_ptr local_90;
  _Base_ptr local_88;
  size_t local_80;
  string *local_70;
  _Rb_tree_node_base *local_68;
  undefined1 local_60 [8];
  _Rb_tree_node_base local_58;
  
  local_12c = CONCAT31(in_register_00000081,criteria_are_next_instr);
  local_1c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1c8._M_impl.super__Rb_tree_header._M_header;
  local_1c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1c8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_70 = secondarySlicingCriteria;
  splitList((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_60,slicingCriteria,',');
  local_1e8._16_8_ = (pointer)0x0;
  local_1e8._0_8_ = (string *)0x0;
  local_1e8._8_8_ = (string *)0x0;
  local_128._16_8_ = (pointer)0x0;
  local_128._0_8_ = (pointer)0x0;
  local_128._8_8_ = (pointer)0x0;
  local_108._0_8_ = (void *)0x0;
  local_108._8_8_ = 0;
  p_Stack_f0 = (_Base_ptr)
               std::
               _Function_handler<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mchalupa[P]dg/tools/llvm-slicer-crit.cpp:931:41)>
               ::_M_invoke;
  local_f8 = (_Link_type)
             std::
             _Function_handler<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mchalupa[P]dg/tools/llvm-slicer-crit.cpp:931:41)>
             ::_M_manager;
  splitStringVector((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_190,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_60,
                    (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                     *)local_108);
  local_a8 = (undefined1  [8])local_128;
  ppStack_a0 = (pointer)local_1e8;
  std::
  tuple<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
  ::operator=((tuple<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
               *)local_a8,
              (pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_190);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_180 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_190);
  if (local_f8 != (_Link_type)0x0) {
    (*(code *)local_f8)(local_108,local_108,3);
  }
  uVar5 = local_128._8_8_;
  if (local_128._0_8_ != local_128._8_8_) {
    pbVar16 = (pointer)local_128._0_8_;
    do {
      iVar10 = std::__cxx11::string::compare((char *)pbVar16);
      if (iVar10 == 0) {
        lVar12 = *(long *)(dg + 0x20);
        for (p_Var11 = *(_Rb_tree_node_base **)(lVar12 + 0xe8);
            p_Var11 != (_Rb_tree_node_base *)(lVar12 + 0xd8);
            p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
          std::
          _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
          ::_M_insert_unique<dg::LLVMNode*const&>
                    ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                      *)&local_1c8,(LLVMNode **)(p_Var11 + 1));
        }
      }
      pbVar16 = pbVar16 + 1;
    } while (pbVar16 != (pointer)uVar5);
    if (local_128._0_8_ != local_128._8_8_) {
      ::dg::LLVMDependenceGraph::getCallSites((vector *)local_128,(set *)&local_1c8);
    }
  }
  uVar5 = local_1e8._8_8_;
  if (local_1e8._0_8_ != local_1e8._8_8_) {
    local_a8 = (undefined1  [8])0x0;
    ppStack_a0 = (pointer)0x0;
    local_98 = (_Link_type)0x0;
    psVar23 = (string *)local_1e8._0_8_;
    do {
      splitList((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_190,psVar23,':');
      uVar6 = local_190._0_8_;
      if (*(ulong *)(local_190._0_8_ + 8) == 0) {
        local_1ec = -1;
        std::
        vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
        ::emplace_back<int,std::__cxx11::string&>
                  ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                    *)local_a8,&local_1ec,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_190._0_8_ + 0x20));
      }
      else {
        uVar20 = 0;
        do {
          if (9 < (int)(*(char **)local_190._0_8_)[uVar20] - 0x30U) {
            pcVar13 = (char *)llvm::errs();
            puVar4 = *(undefined8 **)(pcVar13 + 0x20);
            if ((ulong)(*(long *)(pcVar13 + 0x18) - (long)puVar4) < 0xf) {
              pcVar13 = (char *)llvm::raw_ostream::write(pcVar13,0x12c78a);
            }
            else {
              *(undefined8 *)((long)puVar4 + 7) = 0x27203a656e696c20;
              *puVar4 = 0x2064696c61766e49;
              *(long *)(pcVar13 + 0x20) = *(long *)(pcVar13 + 0x20) + 0xf;
            }
            pcVar13 = (char *)llvm::raw_ostream::write(pcVar13,*(ulong *)local_190._0_8_);
            puVar1 = *(undefined2 **)(pcVar13 + 0x20);
            if ((ulong)(*(long *)(pcVar13 + 0x18) - (long)puVar1) < 3) {
              pcVar13 = (char *)llvm::raw_ostream::write(pcVar13,0x12c79a);
              pcVar24 = *(char **)(pcVar13 + 0x20);
            }
            else {
              *(undefined1 *)(puVar1 + 1) = 0x20;
              *puVar1 = 0x2e27;
              pcVar24 = (char *)(*(long *)(pcVar13 + 0x20) + 3);
              *(char **)(pcVar13 + 0x20) = pcVar24;
            }
            if ((ulong)(*(long *)(pcVar13 + 0x18) - (long)pcVar24) < 0x34) {
              llvm::raw_ostream::write(pcVar13,0x12c79e);
            }
            else {
              builtin_strncpy(pcVar24,"Needs to be a number or empty for global variables.\n",0x34);
              *(long *)(pcVar13 + 0x20) = *(long *)(pcVar13 + 0x20) + 0x34;
            }
            goto LAB_0012538a;
          }
          uVar20 = uVar20 + 1;
        } while (*(ulong *)(local_190._0_8_ + 8) != uVar20);
        local_1ec = atoi(*(char **)local_190._0_8_);
        if (0 < local_1ec) {
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<int&,std::__cxx11::string&>
                    ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                      *)local_a8,&local_1ec,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (uVar6 + 0x20));
        }
      }
LAB_0012538a:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_190);
      psVar23 = psVar23 + 1;
    } while (psVar23 != (string *)uVar5);
    initDebugInfo(dg);
    lVar12 = *(long *)(*(long *)(dg + 0x140) + 0x10);
    local_198 = *(long *)(dg + 0x140) + 8;
    if (lVar12 != local_198) {
      do {
        ppVar8 = ppStack_a0;
        prVar19 = (raw_ostream *)(lVar12 + -0x38);
        auVar22 = local_a8;
        if (lVar12 == 0) {
          prVar19 = (raw_ostream *)0x0;
        }
        for (; auVar22 != (undefined1  [8])ppVar8; auVar22 = (undefined1  [8])((long)auVar22 + 0x28)
            ) {
          if (((pointer)auVar22)->first == -1) {
            auVar25 = llvm::Value::getName();
            lVar21 = auVar25._0_8_;
            local_190._0_8_ = (pointer)local_180;
            if (lVar21 == 0) {
              local_190._8_8_ = (pointer)0x0;
              local_180._0_8_ = local_180._0_8_ & 0xffffffffffffff00;
              if ((((pointer)auVar22)->second)._M_string_length == 0) goto LAB_00125509;
            }
            else {
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_190,lVar21,auVar25._8_8_ + lVar21);
              uVar5 = local_190._0_8_;
              if ((pointer)(((pointer)auVar22)->second)._M_string_length == (pointer)local_190._8_8_
                 ) {
                if ((pointer)local_190._8_8_ == (pointer)0x0) {
                  if ((pointer)local_190._0_8_ != (pointer)local_180) {
                    operator_delete((void *)local_190._0_8_,(ulong)(local_180._0_8_ + 1));
                  }
                }
                else {
                  iVar10 = bcmp((((pointer)auVar22)->second)._M_dataplus._M_p,
                                (void *)local_190._0_8_,local_190._8_8_);
                  if ((pointer)uVar5 != (pointer)local_180) {
                    operator_delete((void *)uVar5,(ulong)(local_180._0_8_ + 1));
                  }
                  if (iVar10 != 0) goto LAB_00125411;
                }
LAB_00125509:
                pcVar13 = (char *)llvm::errs();
                if ((ulong)(*(long *)(pcVar13 + 0x18) - (long)*(char **)(pcVar13 + 0x20)) < 0x18) {
                  pcVar13 = (char *)llvm::raw_ostream::write(pcVar13,0x12c7d3);
                }
                else {
                  builtin_strncpy(*(char **)(pcVar13 + 0x20),"Matched global variable ",0x18);
                  *(long *)(pcVar13 + 0x20) = *(long *)(pcVar13 + 0x20) + 0x18;
                }
                pcVar13 = (char *)llvm::raw_ostream::write
                                            (pcVar13,(ulong)(((pointer)auVar22)->second)._M_dataplus
                                                            ._M_p);
                puVar2 = *(undefined4 **)(pcVar13 + 0x20);
                if ((ulong)(*(long *)(pcVar13 + 0x18) - (long)puVar2) < 5) {
                  pcVar13 = (char *)llvm::raw_ostream::write(pcVar13,0x12c7ec);
                }
                else {
                  *(undefined1 *)(puVar2 + 1) = 10;
                  *puVar2 = 0x3a6f7420;
                  *(long *)(pcVar13 + 0x20) = *(long *)(pcVar13 + 0x20) + 5;
                }
                llvm::Value::print(prVar19,SUB81(pcVar13,0));
                if (*(undefined1 **)(pcVar13 + 0x18) == *(undefined1 **)(pcVar13 + 0x20)) {
                  llvm::raw_ostream::write(pcVar13,0x12c650);
                }
                else {
                  **(undefined1 **)(pcVar13 + 0x20) = 10;
                  *(long *)(pcVar13 + 0x20) = *(long *)(pcVar13 + 0x20) + 1;
                }
                local_190._0_8_ =
                     ::dg::DependenceGraph<dg::LLVMNode>::_getGlobalNode<llvm::Value*>
                               ((DependenceGraph<dg::LLVMNode> *)dg,(Value *)prVar19);
                std::
                _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                ::_M_insert_unique<dg::LLVMNode*const&>
                          ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                            *)&local_1c8,(LLVMNode **)local_190);
                break;
              }
              if ((pointer)local_190._0_8_ != (pointer)local_180) {
                operator_delete((void *)local_190._0_8_,(ulong)(local_180._0_8_ + 1));
              }
            }
          }
LAB_00125411:
        }
        lVar12 = *(long *)(lVar12 + 8);
      } while (lVar12 != local_198);
    }
    if (valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      lVar12 = ::dg::getConstructedFunctions();
      p_Var11 = *(_Rb_tree_node_base **)(lVar12 + 0x18);
      local_68 = (_Rb_tree_node_base *)(lVar12 + 8);
      if (p_Var11 != local_68) {
        do {
          lVar12 = *(long *)(*(long *)(p_Var11 + 1) + 0x50);
          local_198 = *(long *)(p_Var11 + 1) + 0x48;
          if (lVar12 == local_198) {
            lVar21 = 0;
          }
          else {
            do {
              lVar14 = lVar12 + -0x18;
              if (lVar12 == 0) {
                lVar14 = 0;
              }
              lVar21 = *(long *)(lVar14 + 0x30);
            } while ((lVar21 == lVar14 + 0x28) &&
                    (lVar12 = *(long *)(lVar12 + 8), lVar12 != local_198));
          }
          local_b0 = p_Var11;
          if (lVar12 != local_198) {
            do {
              ppVar8 = ppStack_a0;
              I = (Instruction *)(lVar21 + -0x18);
              if (lVar21 == 0) {
                I = (Instruction *)0x0;
              }
              if (local_a8 != (undefined1  [8])ppStack_a0) {
                auVar22 = local_a8;
                do {
                  if ((*(long *)(I + 0x30) != 0) &&
                     (iVar10 = llvm::DebugLoc::getLine(), iVar10 == ((pointer)auVar22)->first)) {
                    bVar9 = instIsCallOf(I,&((pointer)auVar22)->second,
                                         *(LLVMPointerAnalysis **)(dg + 0x148));
                    if (bVar9) {
                      prVar19 = (raw_ostream *)llvm::errs();
                      puVar4 = *(undefined8 **)(prVar19 + 0x20);
                      if ((ulong)(*(long *)(prVar19 + 0x18) - (long)puVar4) < 0xd) {
                        prVar19 = (raw_ostream *)llvm::raw_ostream::write((char *)prVar19,0x12c7f2);
                      }
                      else {
                        *(undefined8 *)((long)puVar4 + 5) = 0x20656e696c206465;
                        *puVar4 = 0x206465686374614d;
                        *(long *)(prVar19 + 0x20) = *(long *)(prVar19 + 0x20) + 0xd;
                      }
                      pcVar13 = (char *)llvm::raw_ostream::operator<<
                                                  (prVar19,(long)((pointer)auVar22)->first);
                      puVar4 = *(undefined8 **)(pcVar13 + 0x20);
                      if ((ulong)(*(long *)(pcVar13 + 0x18) - (long)puVar4) < 0xe) {
                        pcVar24 = " with call of ";
LAB_00125836:
                        pcVar13 = (char *)llvm::raw_ostream::write(pcVar13,(ulong)pcVar24);
                      }
                      else {
                        *(undefined8 *)((long)puVar4 + 6) = 0x20666f206c6c6163;
                        *puVar4 = 0x6163206874697720;
                        *(long *)(pcVar13 + 0x20) = *(long *)(pcVar13 + 0x20) + 0xe;
                      }
                    }
                    else {
                      bVar9 = usesTheVariable(I,&((pointer)auVar22)->second,
                                              *(long *)(dg + 0x148) != 0,(LLVMPointerAnalysis *)0x0)
                      ;
                      if (!bVar9) goto LAB_0012570d;
                      prVar19 = (raw_ostream *)llvm::errs();
                      puVar4 = *(undefined8 **)(prVar19 + 0x20);
                      if ((ulong)(*(long *)(prVar19 + 0x18) - (long)puVar4) < 0xd) {
                        prVar19 = (raw_ostream *)llvm::raw_ostream::write((char *)prVar19,0x12c7f2);
                      }
                      else {
                        *(undefined8 *)((long)puVar4 + 5) = 0x20656e696c206465;
                        *puVar4 = 0x206465686374614d;
                        *(long *)(prVar19 + 0x20) = *(long *)(prVar19 + 0x20) + 0xd;
                      }
                      pcVar13 = (char *)llvm::raw_ostream::operator<<
                                                  (prVar19,(long)((pointer)auVar22)->first);
                      puVar4 = *(undefined8 **)(pcVar13 + 0x20);
                      if ((ulong)(*(long *)(pcVar13 + 0x18) - (long)puVar4) < 0xf) {
                        pcVar24 = " with variable ";
                        goto LAB_00125836;
                      }
                      *(undefined8 *)((long)puVar4 + 7) = 0x20656c6261697261;
                      *puVar4 = 0x6176206874697720;
                      *(long *)(pcVar13 + 0x20) = *(long *)(pcVar13 + 0x20) + 0xf;
                    }
                    pcVar13 = (char *)llvm::raw_ostream::write
                                                (pcVar13,(ulong)(((pointer)auVar22)->second).
                                                                _M_dataplus._M_p);
                    puVar2 = *(undefined4 **)(pcVar13 + 0x20);
                    if ((ulong)(*(long *)(pcVar13 + 0x18) - (long)puVar2) < 5) {
                      pcVar13 = (char *)llvm::raw_ostream::write(pcVar13,0x12c7ec);
                    }
                    else {
                      *(undefined1 *)(puVar2 + 1) = 10;
                      *puVar2 = 0x3a6f7420;
                      *(long *)(pcVar13 + 0x20) = *(long *)(pcVar13 + 0x20) + 5;
                    }
                    llvm::Value::print((raw_ostream *)I,SUB81(pcVar13,0));
                    if (*(undefined1 **)(pcVar13 + 0x18) == *(undefined1 **)(pcVar13 + 0x20)) {
                      llvm::raw_ostream::write(pcVar13,0x12c650);
                    }
                    else {
                      **(undefined1 **)(pcVar13 + 0x20) = 10;
                      *(long *)(pcVar13 + 0x20) = *(long *)(pcVar13 + 0x20) + 1;
                    }
                    local_190._0_8_ =
                         ::dg::DependenceGraph<dg::LLVMNode>::_getNode<llvm::Value*>
                                   ((DependenceGraph<dg::LLVMNode> *)local_b0[1]._M_parent,
                                    (Value *)I);
                    std::
                    _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                    ::_M_insert_unique<dg::LLVMNode*const&>
                              ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                                *)&local_1c8,(LLVMNode **)local_190);
                    break;
                  }
LAB_0012570d:
                  auVar22 = (undefined1  [8])((long)auVar22 + 0x28);
                } while (auVar22 != (undefined1  [8])ppVar8);
              }
              lVar21 = *(long *)(lVar21 + 8);
              lVar14 = lVar12 + -0x18;
              if (lVar12 == 0) {
                lVar14 = 0;
              }
              if (lVar21 == lVar14 + 0x28) {
                for (lVar12 = *(long *)(lVar12 + 8); lVar12 != local_198;
                    lVar12 = *(long *)(lVar12 + 8)) {
                  lVar14 = lVar12 + -0x18;
                  if (lVar12 == 0) {
                    lVar14 = 0;
                  }
                  lVar21 = *(long *)(lVar14 + 0x30);
                  if (lVar21 != lVar14 + 0x28) break;
                }
              }
            } while (lVar12 != local_198);
          }
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_b0);
        } while (p_Var11 != local_68);
      }
    }
    std::
    vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_a8);
  }
  if (((char)local_12c == '\0') ||
     ((pointer)local_1c8._M_impl.super__Rb_tree_header._M_node_count == (pointer)0x0))
  goto LAB_00125b8b;
  p_Var11 = (_Rb_tree_node_base *)(local_190 + 8);
  local_190._8_8_ = local_190._8_8_ & 0xffffffff00000000;
  local_180._0_8_ = (_Link_type)0x0;
  aStack_170._8_8_ = (pointer)0x0;
  local_180._8_8_ = p_Var11;
  aStack_170._M_allocated_capacity = (size_type)p_Var11;
  if ((_Rb_tree_header *)local_1c8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_1c8._M_impl.super__Rb_tree_header) {
    p_Var15 = local_1c8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      V = (Value *)**(long **)(p_Var15 + 1);
      if ((byte)V[0x10] < 0x1b) {
        V = (Value *)0x0;
      }
      lVar12 = *(long *)(V + 0x20);
      if ((lVar12 == *(long *)(V + 0x28) + 0x28) || (lVar12 == 0)) {
        prVar19 = (raw_ostream *)llvm::errs();
        prVar19 = llvm::operator<<(prVar19,V);
        llvm::raw_ostream::operator<<(prVar19,"has no successor that could be criterion\n");
        abort();
      }
      local_a8 = (undefined1  [8])
                 ::dg::DependenceGraph<dg::LLVMNode>::_getNode<llvm::Value*>
                           ((DependenceGraph<dg::LLVMNode> *)(*(long **)(p_Var15 + 1))[1],
                            (Value *)(lVar12 + -0x18));
      std::
      _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
      ::_M_insert_unique<dg::LLVMNode*const&>
                ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                  *)local_190,(LLVMNode **)local_a8);
      p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
    } while ((_Rb_tree_header *)p_Var15 != &local_1c8._M_impl.super__Rb_tree_header);
  }
  uVar7 = aStack_170._M_allocated_capacity;
  uVar6 = local_180._8_8_;
  uVar5 = local_180._0_8_;
  if ((_Link_type)local_1c8._M_impl.super__Rb_tree_header._M_header._M_parent == (_Link_type)0x0) {
    if ((_Link_type)local_180._0_8_ != (_Link_type)0x0) {
      local_1c8._M_impl.super__Rb_tree_header._M_header._M_color = local_190._8_4_;
      *(_Rb_tree_header **)(local_180._0_8_ + 8) = &local_1c8._M_impl.super__Rb_tree_header;
      pbVar16 = (pointer)0x0;
      local_180._0_8_ = (_Link_type)0x0;
      local_180._8_8_ = p_Var11;
      aStack_170._M_allocated_capacity = (size_type)p_Var11;
      goto LAB_00125b24;
    }
  }
  else if ((_Link_type)local_180._0_8_ == (_Link_type)0x0) {
    local_190._8_4_ = local_1c8._M_impl.super__Rb_tree_header._M_header._M_color;
    local_180._0_8_ = local_1c8._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_180._8_8_ = local_1c8._M_impl.super__Rb_tree_header._M_header._M_left;
    aStack_170._M_allocated_capacity =
         (size_type)local_1c8._M_impl.super__Rb_tree_header._M_header._M_right;
    ((_Rb_tree_node_base *)&(local_1c8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_color)
    ->_M_parent = p_Var11;
    aStack_170._8_8_ = local_1c8._M_impl.super__Rb_tree_header._M_node_count;
    local_1c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1c8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1c8._M_impl.super__Rb_tree_header._M_header;
    local_1c8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1c8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1c8._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    local_180._0_8_ = local_1c8._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_180._8_8_ = local_1c8._M_impl.super__Rb_tree_header._M_header._M_left;
    aStack_170._M_allocated_capacity =
         (size_type)local_1c8._M_impl.super__Rb_tree_header._M_header._M_right;
    *(_Rb_tree_header **)(uVar5 + 8) = &local_1c8._M_impl.super__Rb_tree_header;
    ((_Rb_tree_node_base *)&(local_1c8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_color)
    ->_M_parent = p_Var11;
    pbVar16 = (pointer)local_1c8._M_impl.super__Rb_tree_header._M_node_count;
LAB_00125b24:
    local_1c8._M_impl.super__Rb_tree_header._M_node_count = aStack_170._8_8_;
    local_1c8._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar7;
    local_1c8._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)uVar6;
    local_1c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)uVar5;
    aStack_170._8_8_ = pbVar16;
  }
  std::
  _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
  ::_M_erase((_Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
              *)local_190,(_Link_type)local_180._0_8_);
LAB_00125b8b:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_128);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_60);
  if ((pointer)local_1c8._M_impl.super__Rb_tree_header._M_node_count != (pointer)0x0) {
    std::
    _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
    ::swap(&criteria_nodes->_M_t,&local_1c8);
    splitList((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_60,local_70,',');
    p_Stack_f0 = (_Base_ptr)(local_108 + 8);
    local_108._8_8_ = local_108._8_8_ & 0xffffffff00000000;
    local_f8 = (_Link_type)0x0;
    pppBStack_e0 = (_Map_pointer)0x0;
    ppStack_a0 = (pointer)((ulong)ppStack_a0 & 0xffffffff00000000);
    local_98 = (_Link_type)0x0;
    local_80 = 0;
    local_e8 = p_Stack_f0;
    local_90 = (_Base_ptr)&ppStack_a0;
    local_88 = (_Base_ptr)&ppStack_a0;
    if (local_60 != (undefined1  [8])local_58._0_8_) {
      auVar22 = local_60;
      do {
        uVar20 = ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auVar22)->
                 _M_string_length;
        if (((uVar20 < 3) ||
            (pcVar3 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auVar22
                       )->_M_dataplus)._M_p, pcVar3[uVar20 - 2] != '(')) ||
           (pcVar3[uVar20 - 1] != ')')) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auVar22);
        }
        else {
          std::__cxx11::string::substr((ulong)local_190,(ulong)auVar22);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190)
          ;
          if ((pointer)local_190._0_8_ != (pointer)local_180) {
            operator_delete((void *)local_190._0_8_,(ulong)(local_180._0_8_ + 1));
          }
        }
        auVar22 = (undefined1  [8])((long)auVar22 + 0x20);
      } while (auVar22 != (undefined1  [8])local_58._0_8_);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_190,
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_108);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree(&local_160,
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a8,local_98);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_108,local_f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_60);
    ppStack_a0 = (pointer)((ulong)ppStack_a0 & 0xffffffff00000000);
    local_98 = (_Link_type)0x0;
    local_80 = 0;
    local_c8 = (_Base_ptr)0x0;
    pppBStack_c0 = (_Map_pointer)0x0;
    local_d8 = (_Base_ptr)0x0;
    p_Stack_d0 = (_Base_ptr)0x0;
    local_e8 = (_Base_ptr)0x0;
    pppBStack_e0 = (_Map_pointer)0x0;
    local_f8 = (_Link_type)0x0;
    p_Stack_f0 = (_Base_ptr)0x0;
    local_108._0_8_ = (void *)0x0;
    local_108._8_8_ = 0;
    local_90 = (_Base_ptr)&ppStack_a0;
    local_88 = (_Base_ptr)&ppStack_a0;
    std::_Deque_base<dg::BBlock<dg::LLVMNode>_*,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>::
    _M_initialize_map((_Deque_base<dg::BBlock<dg::LLVMNode>_*,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                       *)local_108,0);
    std::
    _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
    ::_Rb_tree((_Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                *)local_60,&criteria_nodes->_M_t);
    if (local_58._M_left != &local_58) {
      p_Var15 = local_58._M_left;
      do {
        pbVar16 = *(pointer *)(*(long *)(p_Var15 + 1) + 0x1d0);
        if (pbVar16 != (pointer)0x0) {
          if (local_d8 == (_Base_ptr)&local_c8[-1]._M_right) {
            local_1e8._0_8_ = pbVar16;
            std::deque<dg::BBlock<dg::LLVMNode>*,std::allocator<dg::BBlock<dg::LLVMNode>*>>::
            _M_push_back_aux<dg::BBlock<dg::LLVMNode>*const&>
                      ((deque<dg::BBlock<dg::LLVMNode>*,std::allocator<dg::BBlock<dg::LLVMNode>*>> *
                       )local_108,(BBlock<dg::LLVMNode> **)local_1e8);
          }
          else {
            *(pointer *)local_d8 = pbVar16;
            local_d8 = (_Base_ptr)&local_d8->_M_parent;
          }
          local_1e8._0_8_ = *(undefined8 *)(*(long *)(p_Var15 + 1) + 0x1d0);
          std::
          _Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
          ::_M_insert_unique<dg::BBlock<dg::LLVMNode>*>
                    ((_Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                      *)local_a8,(BBlock<dg::LLVMNode> **)local_1e8);
          lVar12 = *(long *)(*(long *)(p_Var15 + 1) + 0x1d0);
          for (puVar4 = *(undefined8 **)(lVar12 + 0x10);
              (puVar4 != (undefined8 *)(lVar12 + 0x10) &&
              (psVar23 = (string *)puVar4[2], psVar23 != *(string **)(p_Var15 + 1)));
              puVar4 = (undefined8 *)*puVar4) {
            if (*(long *)((long)&psVar23[0xd].field_2 + 8) != 0) {
              for (p_Var11 = (_Rb_tree_node_base *)psVar23[0xd]._M_string_length;
                  p_Var11 != (_Rb_tree_node_base *)((long)&psVar23[0xc].field_2 + 8);
                  p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
                local_1e8._0_8_ = *(long *)(*(long *)(p_Var11 + 1) + 0x98);
                pVar26 = std::
                         _Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                         ::_M_insert_unique<dg::BBlock<dg::LLVMNode>*const&>
                                   ((_Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                                     *)local_a8,(BBlock<dg::LLVMNode> **)local_1e8);
                if (((undefined1  [16])pVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  if (local_d8 == (_Base_ptr)&local_c8[-1]._M_right) {
                    std::deque<dg::BBlock<dg::LLVMNode>*,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                    ::_M_push_back_aux<dg::BBlock<dg::LLVMNode>*const&>
                              ((deque<dg::BBlock<dg::LLVMNode>*,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                                *)local_108,(BBlock<dg::LLVMNode> **)local_1e8);
                  }
                  else {
                    *(undefined8 *)local_d8 = local_1e8._0_8_;
                    local_d8 = (_Base_ptr)&local_d8->_M_parent;
                  }
                }
              }
            }
            local_1e8._0_8_ = psVar23;
            bVar9 = isCallTo((LLVMNode *)psVar23,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_190);
            if (bVar9) {
              std::
              _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
              ::_M_insert_unique<dg::LLVMNode*const&>
                        ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                          *)criteria_nodes,(LLVMNode **)local_1e8);
              psVar23 = (string *)local_1e8._0_8_;
            }
            bVar9 = isCallTo((LLVMNode *)psVar23,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_160);
            if (bVar9) {
              std::
              _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
              ::_M_insert_unique<dg::LLVMNode*const&>
                        ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                          *)criteria_nodes,(LLVMNode **)local_1e8);
            }
          }
        }
        p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
      } while (p_Var15 != &local_58);
    }
    if ((_Link_type)local_d8 != local_f8) {
      do {
        if (local_d8 == p_Stack_d0) {
          p_Var15 = (_Base_ptr)pppBStack_c0[-1][0x3f];
          operator_delete(p_Stack_d0,0x200);
          p_Stack_d0 = (_Base_ptr)pppBStack_c0[-1];
          local_c8 = p_Stack_d0 + 0x10;
          local_d8 = p_Stack_d0 + 0xf;
          pppBStack_c0 = pppBStack_c0 + -1;
        }
        else {
          p_Var15 = local_d8[-1]._M_right;
          local_d8 = local_d8 + -1;
        }
        local_d8 = (_Base_ptr)&local_d8->_M_right;
        for (p_Var11 = p_Var15[3]._M_left; p_Var11 != p_Var15 + 3;
            p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
          local_128._0_8_ = *(undefined8 *)(p_Var11 + 1);
          paVar17 = &((pointer)local_128._0_8_)->field_2;
          for (puVar4 = (undefined8 *)(((pointer)local_128._0_8_)->field_2)._M_allocated_capacity;
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar4 != paVar17; puVar4 = (undefined8 *)*puVar4) {
            psVar23 = (string *)puVar4[2];
            if (*(long *)((long)&psVar23[0xd].field_2 + 8) != 0) {
              for (p_Var18 = (_Rb_tree_node_base *)psVar23[0xd]._M_string_length;
                  p_Var18 != (_Rb_tree_node_base *)((long)&psVar23[0xc].field_2 + 8);
                  p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18)) {
                local_1e8._0_8_ = *(long *)(*(long *)(p_Var18 + 1) + 0x98);
                pVar26 = std::
                         _Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                         ::_M_insert_unique<dg::BBlock<dg::LLVMNode>*const&>
                                   ((_Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                                     *)local_a8,(BBlock<dg::LLVMNode> **)local_1e8);
                if (((undefined1  [16])pVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  if (local_d8 == (_Base_ptr)&local_c8[-1]._M_right) {
                    std::deque<dg::BBlock<dg::LLVMNode>*,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                    ::_M_push_back_aux<dg::BBlock<dg::LLVMNode>*const&>
                              ((deque<dg::BBlock<dg::LLVMNode>*,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                                *)local_108,(BBlock<dg::LLVMNode> **)local_1e8);
                  }
                  else {
                    *(undefined8 *)local_d8 = local_1e8._0_8_;
                    local_d8 = (_Base_ptr)&local_d8->_M_parent;
                  }
                }
              }
            }
            local_1e8._0_8_ = psVar23;
            bVar9 = isCallTo((LLVMNode *)psVar23,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_190);
            if (bVar9) {
              std::
              _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
              ::_M_insert_unique<dg::LLVMNode*const&>
                        ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                          *)criteria_nodes,(LLVMNode **)local_1e8);
              psVar23 = (string *)local_1e8._0_8_;
            }
            bVar9 = isCallTo((LLVMNode *)psVar23,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_160);
            if (bVar9) {
              std::
              _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
              ::_M_insert_unique<dg::LLVMNode*const&>
                        ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                          *)criteria_nodes,(LLVMNode **)local_1e8);
            }
          }
          pVar26 = std::
                   _Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                   ::_M_insert_unique<dg::BBlock<dg::LLVMNode>*const&>
                             ((_Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                               *)local_a8,(BBlock<dg::LLVMNode> **)local_128);
          if (((undefined1  [16])pVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            if (local_d8 == (_Base_ptr)&local_c8[-1]._M_right) {
              std::deque<dg::BBlock<dg::LLVMNode>*,std::allocator<dg::BBlock<dg::LLVMNode>*>>::
              _M_push_back_aux<dg::BBlock<dg::LLVMNode>*const&>
                        ((deque<dg::BBlock<dg::LLVMNode>*,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                          *)local_108,(BBlock<dg::LLVMNode> **)local_128);
            }
            else {
              *(undefined8 *)local_d8 = local_128._0_8_;
              local_d8 = (_Base_ptr)&local_d8->_M_parent;
            }
          }
        }
      } while ((_Link_type)local_d8 != local_f8);
    }
    std::
    _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
    ::_M_erase((_Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                *)local_60,(_Link_type)local_58._M_parent);
    std::_Deque_base<dg::BBlock<dg::LLVMNode>_*,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>::
    ~_Deque_base((_Deque_base<dg::BBlock<dg::LLVMNode>_*,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                  *)local_108);
    std::
    _Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
    ::_M_erase((_Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                *)local_a8,(_Link_type)local_98);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_160,(_Link_type)local_160._M_impl.super__Rb_tree_header._M_header._M_parent);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_190,(_Link_type)local_180._0_8_);
  }
  std::
  _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
  ::_M_erase(&local_1c8,(_Link_type)local_1c8._M_impl.super__Rb_tree_header._M_header._M_parent);
  return true;
}

Assistant:

bool getSlicingCriteriaNodes(LLVMDependenceGraph &dg,
                             const std::string &slicingCriteria,
                             const std::string &secondarySlicingCriteria,
                             std::set<LLVMNode *> &criteria_nodes,
                             bool criteria_are_next_instr) {
    auto nodes = getPrimarySlicingCriteriaNodes(dg, slicingCriteria,
                                                criteria_are_next_instr);
    if (nodes.empty()) {
        return true; // no criteria found
    }

    criteria_nodes.swap(nodes);

    auto secondaryCriteria =
            parseSecondarySlicingCriteria(secondarySlicingCriteria);
    const auto &secondaryControlCriteria = secondaryCriteria.first;
    const auto &secondaryDataCriteria = secondaryCriteria.second;

    // mark nodes that are going to be in the slice
    if (!findSecondarySlicingCriteria(criteria_nodes, secondaryControlCriteria,
                                      secondaryDataCriteria)) {
        llvm::errs() << "Finding secondary slicing criteria nodes failed\n";
        return false;
    }

    return true;
}